

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate_vx.inc.c
# Opt level: O1

DisasJumpType op_vup(DisasContext_conflict13 *s,DisasOps *o)

{
  MemOp_conflict MVar1;
  uint8_t reg;
  MemOp_conflict MVar2;
  TCGContext_conflict12 *s_00;
  uint8_t enr;
  DisasJumpType DVar3;
  uint uVar4;
  TCGTemp *pTVar5;
  MemOp_conflict MVar6;
  MemOp_conflict MVar7;
  uint uVar8;
  int iVar9;
  byte bVar10;
  uintptr_t o_1;
  TCGv_i64 dst;
  
  uVar8 = (s->fields).presentO;
  if ((((uVar8 >> 0x16 & 1) != 0) && ((uVar8 >> 0x17 & 1) != 0)) && ((uVar8 & 0x10) != 0)) {
    MVar2 = (s->fields).c[2];
    MVar7 = MVar2 & 0xff;
    if (MVar7 < MO_64) {
      s_00 = s->uc->tcg_ctx;
      MVar6 = (uint)((*(uint *)&(s->fields).field_0x8 & 0xfe00) != 0xd400) << 2;
      iVar9 = (s->fields).c[0];
      reg = (uint8_t)(s->fields).c[6];
      MVar1 = MVar2 + MO_16;
      pTVar5 = tcg_temp_new_internal_s390x(s_00,TCG_TYPE_I64,false);
      dst = (TCGv_i64)((long)pTVar5 - (long)s_00);
      uVar8 = (uint)(byte)iVar9;
      bVar10 = (byte)MVar1;
      if (((s->fields).field_0x9 | 2) == 0xd7) {
        if (bVar10 < 5) {
          iVar9 = (0x10U >> (bVar10 & 0x1f)) + 1;
          do {
            enr = (char)iVar9 + 0xfe;
            read_vec_element_i64(s_00,dst,reg,enr,MVar7 | MVar6);
            write_vec_element_i64(s_00,dst,uVar8,enr,MVar1 & 0xff);
            iVar9 = iVar9 + -1;
          } while (1 < iVar9);
        }
      }
      else if (bVar10 < 5) {
        uVar4 = 0x10 >> (bVar10 & 0x1f);
        iVar9 = 0;
        do {
          read_vec_element_i64
                    (s_00,dst,reg,(char)(8 >> ((byte)MVar2 & 0x1f)) + (uint8_t)iVar9,MVar7 | MVar6);
          write_vec_element_i64(s_00,dst,uVar8,(uint8_t)iVar9,MVar1 & 0xff);
          iVar9 = iVar9 + 1;
        } while (uVar4 + (uVar4 == 0) != iVar9);
      }
      tcg_temp_free_internal_s390x(s_00,(TCGTemp *)(dst + (long)s_00));
      DVar3 = DISAS_NEXT;
    }
    else {
      gen_program_exception(s,6);
      DVar3 = DISAS_NORETURN;
    }
    return DVar3;
  }
  __assert_fail("have_field1(s, o)",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/s390x/translate.c"
                ,0x44d,
                "int get_field1(const DisasContext *, enum DisasFieldIndexO, enum DisasFieldIndexC)"
               );
}

Assistant:

static DisasJumpType op_vup(DisasContext *s, DisasOps *o)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    const bool logical = s->fields.op2 == 0xd4 || s->fields.op2 == 0xd5;
    const uint8_t v1 = get_field(s, v1);
    const uint8_t v2 = get_field(s, v2);
    const uint8_t src_es = get_field(s, m3);
    const uint8_t dst_es = src_es + 1;
    int dst_idx, src_idx;
    TCGv_i64 tmp;

    if (src_es > ES_32) {
        gen_program_exception(s, PGM_SPECIFICATION);
        return DISAS_NORETURN;
    }

    tmp = tcg_temp_new_i64(tcg_ctx);
    if (s->fields.op2 == 0xd7 || s->fields.op2 == 0xd5) {
        /* iterate backwards to avoid overwriting data we might need later */
        for (dst_idx = NUM_VEC_ELEMENTS(dst_es) - 1; dst_idx >= 0; dst_idx--) {
            src_idx = dst_idx;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }

    } else {
        /* iterate forward to avoid overwriting data we might need later */
        for (dst_idx = 0; dst_idx < NUM_VEC_ELEMENTS(dst_es); dst_idx++) {
            src_idx = dst_idx + NUM_VEC_ELEMENTS(src_es) / 2;
            read_vec_element_i64(tcg_ctx, tmp, v2, src_idx,
                                 src_es | (logical ? 0 : MO_SIGN));
            write_vec_element_i64(tcg_ctx, tmp, v1, dst_idx, dst_es);
        }
    }
    tcg_temp_free_i64(tcg_ctx, tmp);
    return DISAS_NEXT;
}